

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::SourceLineInfo::operator==(SourceLineInfo *this,SourceLineInfo *other)

{
  __type_conflict local_19;
  SourceLineInfo *other_local;
  SourceLineInfo *this_local;
  
  local_19 = false;
  if (this->line == other->line) {
    local_19 = std::operator==(&this->file,&other->file);
  }
  return local_19;
}

Assistant:

bool SourceLineInfo::operator == ( SourceLineInfo const& other ) const {
        return line == other.line && file == other.file;
    }